

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O3

bool __thiscall avro::BinaryDecoder::decodeBool(BinaryDecoder *this)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pbVar1 = (this->in_).next_;
  if (pbVar1 == (this->in_).end_) {
    StreamReader::more(&this->in_);
    pbVar1 = (this->in_).next_;
  }
  (this->in_).next_ = pbVar1 + 1;
  if (*pbVar1 < 2) {
    return *pbVar1 != 0;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Invalid value for bool","");
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
  *puVar2 = 0x190860;
  puVar2[1] = 0x190890;
  __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

bool BinaryDecoder::decodeBool()
{
    uint8_t v = in_.read();
    if (v == 0) {
        return false;
    } else if (v == 1) {
        return true;
    }
    throw Exception("Invalid value for bool");
}